

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O0

void __thiscall
TApp_IniNotConfigurable_Test::~TApp_IniNotConfigurable_Test(TApp_IniNotConfigurable_Test *this)

{
  TApp_IniNotConfigurable_Test *this_local;
  
  ~TApp_IniNotConfigurable_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, IniNotConfigurable) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);
    bool value;
    app.add_flag("--val", value)->configurable(false);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_THROW(run(), CLI::INIError);
}